

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lttng.cpp
# Opt level: O3

void writeLttng(QFile *file,Provider *provider)

{
  QString *name;
  QString *string;
  int *piVar1;
  int iVar2;
  Argument *pAVar3;
  bool bVar4;
  QTextStream *pQVar5;
  char *pcVar6;
  TraceEnum *pTVar7;
  EnumValue *pEVar8;
  TraceFlags *pTVar9;
  FlagValue *pFVar10;
  Tracepoint *pTVar11;
  Field *pFVar12;
  storage_type_conflict *psVar13;
  char16_t *pcVar14;
  char *pcVar15;
  TraceFlags *f;
  long lVar16;
  TraceFlags *pTVar17;
  Field *pFVar18;
  storage_type_conflict *psVar19;
  qsizetype objectSize;
  QString *pQVar20;
  qsizetype qVar21;
  ulong uVar22;
  EnumValue *v;
  EnumValue *string_00;
  Tracepoint *string_01;
  const_iterator __begin0;
  EnumValue *args;
  FlagValue *pFVar23;
  long lVar24;
  int n;
  const_iterator __begin0_1;
  TraceEnum *name_00;
  FlagValue *args_00;
  long in_FS_OFFSET;
  QStringView lhs;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QStringView rhs;
  QTextStream stream;
  QString local_108;
  QTextStream local_f0;
  QStringBuilder<const_QString_&,_QString> local_e8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_f0,(QIODevice *)file);
  local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.d._0_4_ = 0xaaaaaaaa;
  local_108.d.d._4_4_ = 0xaaaaaaaa;
  local_108.d.ptr._0_4_ = 0xaaaaaaaa;
  local_108.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(file->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])(&local_e8,file);
  QFileInfo::QFileInfo((QFileInfo *)&local_58,(QString *)&local_e8);
  QFileInfo::fileName(&local_108,(QFileInfo *)&local_58);
  QFileInfo::~QFileInfo((QFileInfo *)&local_58);
  if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
    }
  }
  writeCommonPrologue(&local_f0);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  includeGuard(&local_58,&local_108);
  QTextStream::operator<<(&local_f0,"#undef TRACEPOINT_PROVIDER\n");
  pQVar5 = QTextStream::operator<<(&local_f0,"#define TRACEPOINT_PROVIDER ");
  pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
  QTextStream::operator<<(pQVar5,"\n");
  QTextStream::operator<<(&local_f0,"\n");
  pQVar5 = QTextStream::operator<<(&local_f0,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
  QTextStream::operator<<(pQVar5,")\n");
  pcVar6 = qtHeaders();
  QTextStream::operator<<(&local_f0,pcVar6);
  QTextStream::operator<<(&local_f0,"\n");
  if ((provider->prefixText).d.size != 0) {
    local_78.d.d = (Data *)CONCAT62(local_78.d.d._2_6_,10);
    QtPrivate::QStringList_join((QString *)&local_e8,&provider->prefixText,(QChar *)&local_78,1);
    pQVar5 = QTextStream::operator<<(&local_f0,(QString *)&local_e8);
    QTextStream::operator<<(pQVar5,"\n\n");
    if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
      }
    }
  }
  QTextStream::operator<<(&local_f0,"#endif\n\n");
  pQVar5 = QTextStream::operator<<(&local_f0,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
  QTextStream::operator<<(pQVar5,") || defined(TRACEPOINT_HEADER_MULTI_READ)\n");
  pQVar5 = QTextStream::operator<<(&local_f0,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#undef TRACEPOINT_INCLUDE\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define TRACEPOINT_INCLUDE \"");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_108);
  QTextStream::operator<<(pQVar5,"\"\n\n");
  QTextStream::operator<<(&local_f0,"#include <lttng/tracepoint.h>\n\n");
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.b.d.d = (Data *)0x0;
  local_e8.b.d.ptr = L"_USE_NAMESPACE";
  local_e8.b.d.size = 0xe;
  local_e8.a = (QString *)&local_58;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>(&local_78,&local_e8);
  if (&(local_e8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = QTextStream::operator<<(&local_f0,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
  pQVar5 = QTextStream::operator<<(pQVar5,")\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"QT_USE_NAMESPACE\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
  pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
  QTextStream::operator<<(pQVar5,"\n\n");
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar16 = (provider->enumerations).d.size;
  if (lVar16 != 0) {
    name_00 = (provider->enumerations).d.ptr;
    pTVar7 = name_00 + lVar16;
    do {
      pQVar5 = QTextStream::operator<<(&local_f0,"TRACEPOINT_ENUM(\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      typeToTypeName((QString *)&local_e8,&name_00->name);
      pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      QTextStream::operator<<(pQVar5,"    TP_ENUM_VALUES(\n");
      if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
        }
      }
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      lVar16 = (name_00->values).d.size;
      if (lVar16 != 0) {
        string_00 = (name_00->values).d.ptr;
        pEVar8 = string_00 + lVar16;
        do {
          if (string_00->range < 1) {
            if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
              lVar16 = 0;
              do {
                if (local_58.d.size << 2 == lVar16) goto LAB_0010e41a;
                lVar24 = lVar16 + 4;
                piVar1 = (int *)((long)local_58.d.ptr + lVar16);
                lVar16 = lVar24;
              } while (*piVar1 != string_00->value);
              if (lVar24 != 0) goto LAB_0010e545;
            }
LAB_0010e41a:
            pQVar5 = QTextStream::operator<<(&local_f0,"        ctf_enum_value(\"");
            iVar2 = string_00->value;
            args = (name_00->values).d.ptr;
            lVar16 = (name_00->values).d.size;
            local_e8.a = (QString *)0x0;
            local_e8.b.d.d = (Data *)0x0;
            local_e8.b.d.ptr = (char16_t *)0x0;
            if (lVar16 != 0) {
              lVar16 = lVar16 << 5;
              do {
                if (args->value == iVar2) {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_e8,(qsizetype)local_e8.b.d.ptr,
                             &args->name);
                  QList<QString>::end((QList<QString> *)&local_e8);
                }
                args = args + 1;
                lVar16 = lVar16 + -0x20;
              } while (lVar16 != 0);
            }
            local_90.d.d._0_2_ = 0x5f;
            QtPrivate::QStringList_join(&local_78,(QStringList *)&local_e8,(QChar *)&local_90,1);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_e8);
            pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
            pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string_00->value);
            QTextStream::operator<<(pQVar5,")\n");
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_e8.a = (QString *)CONCAT44(local_e8.a._4_4_,string_00->value);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_e8);
            QList<int>::end((QList<int> *)&local_58);
          }
          else {
            pQVar5 = QTextStream::operator<<(&local_f0,"        ctf_enum_range(\"");
            pQVar5 = QTextStream::operator<<(pQVar5,&string_00->name);
            pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string_00->value);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string_00->range);
            QTextStream::operator<<(pQVar5,")\n");
          }
LAB_0010e545:
          string_00 = string_00 + 1;
        } while (string_00 != pEVar8);
      }
      QTextStream::operator<<(&local_f0,"    )\n)\n\n");
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
      name_00 = name_00 + 1;
    } while (name_00 != pTVar7);
  }
  lVar16 = (provider->flags).d.size;
  if (lVar16 != 0) {
    pTVar17 = (provider->flags).d.ptr;
    pTVar9 = pTVar17 + lVar16;
    do {
      pQVar5 = QTextStream::operator<<(&local_f0,"TRACEPOINT_ENUM(\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      typeToTypeName((QString *)&local_e8,&pTVar17->name);
      pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      QTextStream::operator<<(pQVar5,"    TP_ENUM_VALUES(\n");
      if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
        }
      }
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      lVar16 = (pTVar17->values).d.size;
      if (lVar16 != 0) {
        pFVar23 = (pTVar17->values).d.ptr;
        pFVar10 = pFVar23 + lVar16;
        do {
          if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_0010e6e3:
            pQVar5 = QTextStream::operator<<(&local_f0,"        ctf_enum_value(\"");
            iVar2 = pFVar23->value;
            args_00 = (pTVar17->values).d.ptr;
            lVar16 = (pTVar17->values).d.size;
            local_e8.a = (QString *)0x0;
            local_e8.b.d.d = (Data *)0x0;
            local_e8.b.d.ptr = (char16_t *)0x0;
            if (lVar16 != 0) {
              lVar16 = lVar16 << 5;
              do {
                if (args_00->value == iVar2) {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_e8,(qsizetype)local_e8.b.d.ptr,
                             &args_00->name);
                  QList<QString>::end((QList<QString> *)&local_e8);
                }
                args_00 = args_00 + 1;
                lVar16 = lVar16 + -0x20;
              } while (lVar16 != 0);
            }
            local_90.d.d._0_2_ = 0x5f;
            QtPrivate::QStringList_join(&local_78,(QStringList *)&local_e8,(QChar *)&local_90,1);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_e8);
            pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
            pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
            pQVar5 = QTextStream::operator<<(pQVar5,pFVar23->value);
            QTextStream::operator<<(pQVar5,")\n");
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_e8.a = (QString *)CONCAT44(local_e8.a._4_4_,pFVar23->value);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_e8);
            QList<int>::end((QList<int> *)&local_58);
          }
          else {
            lVar16 = 0;
            do {
              if (local_58.d.size << 2 == lVar16) goto LAB_0010e6e3;
              lVar24 = lVar16 + 4;
              piVar1 = (int *)((long)local_58.d.ptr + lVar16);
              lVar16 = lVar24;
            } while (*piVar1 != pFVar23->value);
            if (lVar24 == 0) goto LAB_0010e6e3;
          }
          pFVar23 = pFVar23 + 1;
        } while (pFVar23 != pFVar10);
      }
      QTextStream::operator<<(&local_f0,"    )\n)\n\n");
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != pTVar9);
  }
  local_e8.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = L"TP_%1_CONVERTERS";
  local_78.d.size = 0x10;
  qVar21 = 0;
  a.m_size = (provider->name).d.size * 4 + 2;
  a.field_0.m_data_utf16 = (provider->name).d.ptr;
  QString::arg_impl(&local_58,&local_78,a,0,(QChar)0x20);
  QString::toUpper_helper((QString *)&local_e8,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = QTextStream::operator<<(&local_f0,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#ifndef ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
  QTextStream::operator<<(pQVar5,"\n");
  QTextStream::operator<<(&local_f0,"QT_BEGIN_NAMESPACE\n");
  QTextStream::operator<<(&local_f0,"namespace QtPrivate {\n");
  lVar16 = (provider->flags).d.size;
  if (lVar16 != 0) {
    pTVar17 = (provider->flags).d.ptr;
    pTVar9 = pTVar17 + lVar16;
    do {
      pQVar5 = QTextStream::operator<<(&local_f0,"inline QByteArray trace_convert_");
      typeToTypeName(&local_58,&pTVar17->name);
      pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
      pQVar5 = QTextStream::operator<<(pQVar5,"(");
      pQVar5 = QTextStream::operator<<(pQVar5,&pTVar17->name);
      QTextStream::operator<<(pQVar5," val)\n");
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QTextStream::operator<<(&local_f0,"{\n");
      QTextStream::operator<<(&local_f0,"    QByteArray ret;\n");
      QTextStream::operator<<(&local_f0,"    if (val == 0) { ret.append((char)0); return ret; }\n");
      lVar16 = (pTVar17->values).d.size;
      if (lVar16 != 0) {
        pFVar23 = (pTVar17->values).d.ptr;
        lVar24 = 0;
        do {
          if (*(int *)((long)&pFVar23->value + lVar24) != 0) {
            pQVar5 = QTextStream::operator<<(&local_f0,"    if (val & ");
            pQVar5 = QTextStream::operator<<
                               (pQVar5,1 << (*(char *)((long)&pFVar23->value + lVar24) - 1U & 0x1f))
            ;
            pQVar5 = QTextStream::operator<<(pQVar5,") { ret.append((char)");
            pQVar5 = QTextStream::operator<<(pQVar5,*(int *)((long)&pFVar23->value + lVar24));
            QTextStream::operator<<(pQVar5,"); };\n");
          }
          lVar24 = lVar24 + 0x20;
        } while (lVar16 << 5 != lVar24);
      }
      QTextStream::operator<<(&local_f0,"    return ret;\n");
      QTextStream::operator<<(&local_f0,"}\n");
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != pTVar9);
  }
  pQVar5 = QTextStream::operator<<(&local_f0,"} // namespace QtPrivate\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"QT_END_NAMESPACE\n\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
  QTextStream::operator<<(pQVar5,"\n\n");
  if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
    }
  }
  lVar16 = (provider->tracepoints).d.size;
  if (lVar16 != 0) {
    string_01 = (provider->tracepoints).d.ptr;
    pTVar11 = string_01 + lVar16;
    do {
      pQVar5 = QTextStream::operator<<(&local_f0,"TRACEPOINT_EVENT(\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    ");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,",\n");
      QTextStream::operator<<(pQVar5,"    TP_ARGS(");
      if ((string_01->args).d.size != 0) {
        lVar16 = 0x18;
        lVar24 = 0;
        uVar22 = 0;
        pcVar6 = (char *)0x0;
        do {
          pAVar3 = (string_01->args).d.ptr;
          iVar2 = *(int *)((long)&((string_01->fields).d.ptr)->backendType + lVar24);
          pQVar5 = QTextStream::operator<<(&local_f0,pcVar6);
          if (iVar2 == 0xf) {
            pQVar5 = QTextStream::operator<<(pQVar5,"QByteArray, ");
          }
          else {
            pQVar5 = QTextStream::operator<<(pQVar5,(QString *)((long)pAVar3 + lVar16 + -0x18));
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
          }
          QTextStream::operator<<(pQVar5,(QString *)((long)&(pAVar3->type).d.d + lVar16));
          uVar22 = uVar22 + 1;
          lVar24 = lVar24 + 0x58;
          lVar16 = lVar16 + 0x38;
          pcVar6 = ", ";
        } while (uVar22 < (ulong)(string_01->args).d.size);
      }
      pQVar5 = QTextStream::operator<<(&local_f0,"),\n");
      QTextStream::operator<<(pQVar5,"    TP_FIELDS(");
      lVar16 = (string_01->fields).d.size;
      if (lVar16 != 0) {
        pFVar18 = (string_01->fields).d.ptr;
        pFVar12 = pFVar18 + lVar16;
        pcVar6 = (char *)0x0;
        do {
          QTextStream::operator<<(&local_f0,pcVar6);
          name = &pFVar18->paramType;
          string = &pFVar18->name;
          iVar2 = pFVar18->arrayLen;
          if (0 < iVar2) {
            lVar16 = (pFVar18->paramType).d.size;
            if (lVar16 == 5) {
              psVar19 = (storage_type_conflict *)0x5;
              psVar13 = (storage_type_conflict *)0x5;
              pcVar14 = L"float";
LAB_0010eda7:
              lhs.m_size = (qsizetype)pcVar14;
              lhs.m_data = psVar19;
              rhs.m_size = qVar21;
              rhs.m_data = psVar13;
              bVar4 = QtPrivate::equalStrings((QtPrivate *)(pFVar18->paramType).d.ptr,lhs,rhs);
              if (bVar4) {
                n = 0;
                pcVar6 = (char *)0x0;
                do {
                  QTextStream::operator<<(&local_f0,pcVar6);
                  pQVar5 = QTextStream::operator<<(&local_f0,"ctf_float(");
                  pQVar5 = QTextStream::operator<<(pQVar5,name);
                  pQVar5 = QTextStream::operator<<(pQVar5,", ");
                  pQVar5 = QTextStream::operator<<(pQVar5,string);
                  pQVar5 = QTextStream::operator<<(pQVar5,"_");
                  QString::number((QString *)&local_e8,n,10);
                  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
                  pQVar5 = QTextStream::operator<<(pQVar5,", ");
                  pQVar5 = QTextStream::operator<<(pQVar5,string);
                  pQVar5 = QTextStream::operator<<(pQVar5,"[");
                  QString::number(&local_58,n,10);
                  pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
                  pQVar5 = QTextStream::operator<<(pQVar5,"]");
                  QTextStream::operator<<(pQVar5,")");
                  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
                    }
                  }
                  n = n + 1;
                  pcVar6 = "\n        ";
                } while (iVar2 != n);
                goto switchD_0010ed82_default;
              }
            }
            else if (lVar16 == 6) {
              psVar19 = (storage_type_conflict *)0x6;
              psVar13 = (storage_type_conflict *)0x6;
              pcVar14 = L"double";
              goto LAB_0010eda7;
            }
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_array(");
            pQVar5 = QTextStream::operator<<(pQVar5,name);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,iVar2);
            goto LAB_0010f2c5;
          }
          pQVar20 = string;
          switch(pFVar18->backendType) {
          case Sequence:
            pQVar20 = &pFVar18->seqLen;
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_sequence(");
            pQVar5 = QTextStream::operator<<(pQVar5,name);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", unsigned int, ");
            goto LAB_0010f2c0;
          case Boolean:
          case Integer:
            pcVar6 = "ctf_integer(";
            goto LAB_0010f27b;
          case IntegerHex:
          case Pointer:
            pcVar6 = "ctf_integer_hex(";
            goto LAB_0010f27b;
          case Float:
            pcVar6 = "ctf_float(";
LAB_0010f27b:
            pQVar5 = QTextStream::operator<<(&local_f0,pcVar6);
            pQVar5 = QTextStream::operator<<(pQVar5,name);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
LAB_0010f2c0:
            pQVar5 = QTextStream::operator<<(pQVar5,pQVar20);
LAB_0010f2c5:
            pcVar6 = ")";
            break;
          case String:
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_string(");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            goto LAB_0010f2c0;
          case QtString:
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_string(");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pcVar6 = ".toUtf8().constData())";
            break;
          case QtByteArray:
            pcVar6 = "ctf_sequence(const char, ";
            goto LAB_0010f300;
          case QtUrl:
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_string(");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pcVar6 = ".toString().toUtf8().constData())";
            break;
          case QtRect:
            pcVar6 = "ctf_integer(int, QRect_";
            goto LAB_0010f385;
          case QtSize:
            pcVar6 = "ctf_integer(int, QSize_";
            goto LAB_0010f364;
          case QtRectF:
            pcVar6 = "ctf_float(double, QRectF_";
LAB_0010f385:
            pQVar5 = QTextStream::operator<<(&local_f0,pcVar6);
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,"_x, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,".x()) ");
            pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,"_y, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,".y()) ");
            pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
LAB_0010f413:
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,"_width, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,".width()) ");
            pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,"_height, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pcVar6 = ".height()) ";
            break;
          case QtSizeF:
            pcVar6 = "ctf_float(double, QSizeF_";
LAB_0010f364:
            pQVar5 = QTextStream::operator<<(&local_f0,pcVar6);
            goto LAB_0010f413;
          case EnumeratedType:
            pQVar5 = QTextStream::operator<<(&local_f0,"ctf_enum(");
            pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            typeToTypeName((QString *)&local_e8,name);
            pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
            pQVar5 = QTextStream::operator<<(pQVar5,", int, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            QTextStream::operator<<(pQVar5,") ");
            if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                objectSize = 2;
LAB_0010f0e8:
                QArrayData::deallocate((QArrayData *)local_e8.a,objectSize,0x10);
              }
            }
            goto switchD_0010ed82_default;
          case FlagType:
            pcVar6 = "ctf_sequence(const char , ";
LAB_0010f300:
            pQVar5 = QTextStream::operator<<(&local_f0,pcVar6);
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pQVar5 = QTextStream::operator<<(pQVar5,".constData(), unsigned int, ");
            pQVar5 = QTextStream::operator<<(pQVar5,string);
            pcVar6 = ".size())";
            break;
          case Unknown:
            QString::toLocal8Bit_helper
                      ((QByteArray *)&local_e8,(QChar *)(pFVar18->paramType).d.ptr,
                       (pFVar18->paramType).d.size);
            pcVar6 = (char *)local_e8.b.d.d;
            if (local_e8.b.d.d == (Data *)0x0) {
              pcVar6 = "";
            }
            QString::toLocal8Bit_helper
                      ((QByteArray *)&local_58,(QChar *)(pFVar18->name).d.ptr,(pFVar18->name).d.size
                      );
            pcVar15 = (char *)local_58.d.ptr;
            if (local_58.d.ptr == (char16_t *)0x0) {
              pcVar15 = "";
            }
            panic("Cannot deduce CTF type for \'%s %s",pcVar6,pcVar15);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                objectSize = 1;
                goto LAB_0010f0e8;
              }
            }
          default:
            goto switchD_0010ed82_default;
          }
          QTextStream::operator<<(pQVar5,pcVar6);
switchD_0010ed82_default:
          pFVar18 = pFVar18 + 1;
          pcVar6 = "\n        ";
        } while (pFVar18 != pFVar12);
      }
      QTextStream::operator<<(&local_f0,")\n)\n\n");
      local_e8.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      formatFunctionSignature((QString *)&local_e8,&string_01->args);
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      formatParameterList(&local_58,provider,&string_01->args,&string_01->fields,LTTNG);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_c0.d.d = (Data *)0x0;
      local_c0.d.ptr = L"TP_%1_%2";
      local_c0.d.size = 8;
      a_00.m_size = (provider->name).d.size * 4 + 2;
      a_00.field_0.m_data_utf16 = (provider->name).d.ptr;
      QString::arg_impl(&local_a8,&local_c0,a_00,0,(QChar)0x20);
      qVar21 = 0;
      a_01.m_size = (string_01->name).d.size * 4 + 2;
      a_01.field_0.m_data_utf16 = (string_01->name).d.ptr;
      QString::arg_impl(&local_90,&local_a8,a_01,0,(QChar)0x20);
      QString::toUpper_helper(&local_78,&local_90);
      piVar1 = (int *)CONCAT62(local_90.d.d._2_6_,local_90.d.d._0_2_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_90.d.d._2_6_,local_90.d.d._0_2_),2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = QTextStream::operator<<(&local_f0,"\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"#ifndef ");
      pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
      pQVar5 = QTextStream::operator<<(pQVar5,"\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
      pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
      pQVar5 = QTextStream::operator<<(pQVar5,"\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"QT_BEGIN_NAMESPACE\n");
      QTextStream::operator<<(pQVar5,"namespace QtPrivate {\n");
      pQVar5 = QTextStream::operator<<(&local_f0,"inline void trace_");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,"(");
      pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
      pQVar5 = QTextStream::operator<<(pQVar5,")\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    tracepoint(");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,", ");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
      pQVar5 = QTextStream::operator<<(pQVar5,");\n");
      QTextStream::operator<<(pQVar5,"}\n");
      pQVar5 = QTextStream::operator<<(&local_f0,"inline void do_trace_");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,"(");
      pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
      pQVar5 = QTextStream::operator<<(pQVar5,")\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    do_tracepoint(");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,", ");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,&local_58);
      pQVar5 = QTextStream::operator<<(pQVar5,");\n");
      QTextStream::operator<<(pQVar5,"}\n");
      pQVar5 = QTextStream::operator<<(&local_f0,"inline bool trace_");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,"_enabled()\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"    return tracepoint_enabled(");
      pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
      pQVar5 = QTextStream::operator<<(pQVar5,", ");
      pQVar5 = QTextStream::operator<<(pQVar5,&string_01->name);
      pQVar5 = QTextStream::operator<<(pQVar5,");\n");
      QTextStream::operator<<(pQVar5,"}\n");
      pQVar5 = QTextStream::operator<<(&local_f0,"} // namespace QtPrivate\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"QT_END_NAMESPACE\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
      pQVar5 = QTextStream::operator<<(pQVar5,&local_78);
      QTextStream::operator<<(pQVar5,"\n\n");
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
        }
      }
      string_01 = string_01 + 1;
    } while (string_01 != pTVar11);
  }
  QTextStream::operator<<(&local_f0,"\n");
  pQVar5 = QTextStream::operator<<(&local_f0,"#endif // ");
  includeGuard((QString *)&local_e8,&local_108);
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_e8);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#include <lttng/tracepoint-event.h>\n");
  QTextStream::operator<<(pQVar5,"#include <private/qtrace_p.h>\n");
  if ((QArrayData *)local_e8.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_e8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(local_108.d.d._4_4_,local_108.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_108.d.d._4_4_,local_108.d.d._0_4_),2,0x10)
      ;
    }
  }
  QTextStream::~QTextStream(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void writeLttng(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeEnums(stream, provider);
    writeFlags(stream, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}